

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Core.cpp
# Opt level: O2

bool __thiscall IRCCorePlugin::initialize(IRCCorePlugin *this)

{
  basic_string_view<char,_std::char_traits<char>_> *entry;
  pointer pbVar1;
  string_view serverList;
  container_type server_entries;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  serverList = (string_view)Jupiter::Config::get(&this->field_0x38,7,"Servers",0,0);
  if (serverList._M_len != 0) {
    *(undefined1 **)(_serverManager + 0x20) = &this->field_0x38;
    local_28._M_len = 2;
    local_28._M_str = " \t";
    jessilib::
    word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              (&server_entries,&serverList,&local_28);
    for (pbVar1 = server_entries.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 != server_entries.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
      ServerManager::addServer(_serverManager,pbVar1->_M_len,pbVar1->_M_str);
    }
    std::
    _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Vector_base(&server_entries.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   );
  }
  return true;
}

Assistant:

bool IRCCorePlugin::initialize() {
	// TODO: initialize() isn't bringing in generic commands from already-loaded plugins
	std::string_view serverList = this->config.get("Servers"sv);
	if (!serverList.empty()) {
		serverManager->setConfig(this->config);

		auto server_entries = jessilib::word_split_view(serverList, WHITESPACE_SV);
		for (const auto& entry : server_entries) {
			serverManager->addServer(entry);
		}
	}

	return true;
}